

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::ArrayOutputStream::ArrayOutputStream
          (ArrayOutputStream *this,void *data,int size,int block_size)

{
  int local_34;
  int block_size_local;
  int size_local;
  void *data_local;
  ArrayOutputStream *this_local;
  
  ZeroCopyOutputStream::ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__ArrayOutputStream_00a1a558;
  this->data_ = (uint8_t *)data;
  this->size_ = size;
  local_34 = size;
  if (0 < block_size) {
    local_34 = block_size;
  }
  this->block_size_ = local_34;
  this->position_ = 0;
  this->last_returned_size_ = 0;
  return;
}

Assistant:

ArrayOutputStream::ArrayOutputStream(void* data, int size, int block_size)
    : data_(reinterpret_cast<uint8_t*>(data)),
      size_(size),
      block_size_(block_size > 0 ? block_size : size),
      position_(0),
      last_returned_size_(0) {}